

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O3

SRes SzReadFileNames(Byte *data,size_t size,UInt32 numFiles,size_t *offsets)

{
  size_t sVar1;
  bool bVar3;
  size_t sVar2;
  
  *offsets = 0;
  if (numFiles == 0) {
    bVar3 = size == 0;
  }
  else {
    if (((size < 2) || (data[size - 2] != '\0')) || (data[size - 1] != '\0')) {
      return 0x10;
    }
    sVar1 = 0;
    do {
      if (sVar1 == size) {
        return 0x10;
      }
      offsets = offsets + 1;
      do {
        do {
          sVar2 = sVar1;
          sVar1 = sVar2 + 2;
        } while (data[sVar2] != '\0');
      } while (data[sVar2 + 1] != '\0');
      *offsets = sVar1 >> 1;
      numFiles = numFiles - 1;
    } while (numFiles != 0);
    bVar3 = size == sVar1;
  }
  return (uint)!bVar3 << 4;
}

Assistant:

static SRes SzReadFileNames(const Byte *data, size_t size, UInt32 numFiles, size_t *offsets)
{
  size_t pos = 0;
  *offsets++ = 0;
  if (numFiles == 0)
    return (size == 0) ? SZ_OK : SZ_ERROR_ARCHIVE;
  if (size < 2)
    return SZ_ERROR_ARCHIVE;
  if (data[size - 2] != 0 || data[size - 1] != 0)
    return SZ_ERROR_ARCHIVE;
  do
  {
    const Byte *p;
    if (pos == size)
      return SZ_ERROR_ARCHIVE;
    for (p = data + pos;
      #ifdef _WIN32
      *(const UInt16 *)p != 0
      #else
      p[0] != 0 || p[1] != 0
      #endif
      ; p += 2);
    pos = p - data + 2;
    *offsets++ = (pos >> 1);
  }
  while (--numFiles);
  return (pos == size) ? SZ_OK : SZ_ERROR_ARCHIVE;
}